

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsInitializeCounters(ARKLsMem arkls_mem)

{
  arkls_mem->ncfl = 0;
  arkls_mem->njtsetup = 0;
  arkls_mem->nli = 0;
  arkls_mem->nps = 0;
  arkls_mem->nstlj = 0;
  arkls_mem->npe = 0;
  arkls_mem->nje = 0;
  arkls_mem->nfeDQ = 0;
  arkls_mem->njtimes = 0;
  return 0;
}

Assistant:

int arkLsInitializeCounters(ARKLsMem arkls_mem)
{
  arkls_mem->nje      = 0;
  arkls_mem->nfeDQ    = 0;
  arkls_mem->nstlj    = 0;
  arkls_mem->npe      = 0;
  arkls_mem->nli      = 0;
  arkls_mem->nps      = 0;
  arkls_mem->ncfl     = 0;
  arkls_mem->njtsetup = 0;
  arkls_mem->njtimes  = 0;
  return(0);
}